

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferViewAccessTests.cpp
# Opt level: O2

TestCaseGroup * vkt::api::createBufferViewAccessTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  ostream *poVar2;
  BufferViewTestCase *pBVar3;
  BufferViewCaseParams bufferViewTestInfo;
  allocator<char> local_1e9;
  string local_1e8;
  string local_1c8;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> bufferViewTests;
  ostringstream description;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"access","BufferView Access Tests");
  bufferViewTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
  poVar2 = std::operator<<((ostream *)&description,"bufferSize: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," bufferViewSize: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," bufferView element offset: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  pTVar1 = bufferViewTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pBVar3 = (BufferViewTestCase *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"buffer_view_memory_test_complete",&local_1e9);
  std::__cxx11::stringbuf::str();
  anon_unknown_1::BufferViewTestCase::BufferViewTestCase
            (pBVar3,testCtx,&local_1c8,&local_1e8,(BufferViewCaseParams)ZEXT812(0x20000000200));
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pBVar3);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
  poVar2 = std::operator<<((ostream *)&description,"bufferSize: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," bufferViewSize: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," bufferView element offset: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  pTVar1 = bufferViewTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pBVar3 = (BufferViewTestCase *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"buffer_view_memory_test_partial_offset0",&local_1e9);
  std::__cxx11::stringbuf::str();
  anon_unknown_1::BufferViewTestCase::BufferViewTestCase
            (pBVar3,testCtx,&local_1c8,&local_1e8,(BufferViewCaseParams)ZEXT812(0x20000001000));
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pBVar3);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
  poVar2 = std::operator<<((ostream *)&description,"bufferSize: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," bufferViewSize: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," bufferView element offset: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  pTVar1 = bufferViewTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pBVar3 = (BufferViewTestCase *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"buffer_view_memory_test_partial_offset1",&local_1e9);
  std::__cxx11::stringbuf::str();
  bufferViewTestInfo.elementOffset = 0x80;
  bufferViewTestInfo.bufferSize = 0x1000;
  bufferViewTestInfo.bufferViewSize = 0x200;
  anon_unknown_1::BufferViewTestCase::BufferViewTestCase
            (pBVar3,testCtx,&local_1c8,&local_1e8,bufferViewTestInfo);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pBVar3);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
  pTVar1 = bufferViewTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  bufferViewTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&bufferViewTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createBufferViewAccessTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	bufferViewTests	(new tcu::TestCaseGroup(testCtx, "access", "BufferView Access Tests"));

	{
		BufferViewCaseParams info =
		{
			512,	// deUint32	bufferSize
			512,	// deUint32	bufferViewSize
			0,		// deUint32	elementOffset
		};
		std::ostringstream description;
		description << "bufferSize: " << info.bufferSize << " bufferViewSize: " << info.bufferViewSize << " bufferView element offset: " << info.elementOffset;
		bufferViewTests->addChild(new BufferViewTestCase(testCtx, "buffer_view_memory_test_complete", description.str(), info));
	}

	{
		BufferViewCaseParams info =
		{
			4096,	// deUint32	bufferSize
			512,	// deUint32	bufferViewSize
			0,		// deUint32	elementOffset
		};
		std::ostringstream description;
		description << "bufferSize: " << info.bufferSize << " bufferViewSize: " << info.bufferViewSize << " bufferView element offset: " << info.elementOffset;
		bufferViewTests->addChild(new BufferViewTestCase(testCtx, "buffer_view_memory_test_partial_offset0", description.str(), info));
	}

	{
		BufferViewCaseParams info =
		{
			4096,	// deUint32	bufferSize
			512,	// deUint32	bufferViewSize
			128,	// deUint32	elementOffset
		};
		std::ostringstream description;
		description << "bufferSize: " << info.bufferSize << " bufferViewSize: " << info.bufferViewSize << " bufferView element offset: " << info.elementOffset;
		bufferViewTests->addChild(new BufferViewTestCase(testCtx, "buffer_view_memory_test_partial_offset1", description.str(), info));
	}

	return bufferViewTests.release();
}